

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LossParameter::LossParameter(LossParameter *this,LossParameter *from)

{
  void *pvVar1;
  bool bVar2;
  undefined3 uVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LossParameter_0075fe20;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->normalization_ = from->normalization_;
  bVar2 = from->normalize_;
  uVar3 = *(undefined3 *)&from->field_0x1d;
  this->ignore_label_ = from->ignore_label_;
  this->normalize_ = bVar2;
  *(undefined3 *)&this->field_0x1d = uVar3;
  return;
}

Assistant:

LossParameter::LossParameter(const LossParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&ignore_label_, &from.ignore_label_,
    reinterpret_cast<char*>(&normalization_) -
    reinterpret_cast<char*>(&ignore_label_) + sizeof(normalization_));
  // @@protoc_insertion_point(copy_constructor:caffe.LossParameter)
}